

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

NodeBase * __thiscall
SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
UnlinkCurrentNode(EditingIterator *this)

{
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  NodeBase *pNVar6;
  
  pSVar1 = (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_Iterator).current;
  pSVar5 = pSVar1;
  if (pSVar1 == (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar3) goto LAB_004768b6;
    *puVar4 = 0;
    pSVar5 = (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::ArenaAllocator,_RealCount> *)
             (this->super_Iterator).current;
  }
  if (pSVar5 == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar3) goto LAB_004768b6;
    *puVar4 = 0;
  }
  pNVar6 = this->last;
  if (pNVar6 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar3) {
LAB_004768b6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pNVar6 = this->last;
  }
  pNVar6->next = ((this->super_Iterator).current)->next;
  pSVar5 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pSVar5 = pSVar5 + 8;
  *(int *)pSVar5 = *(int *)pSVar5 + -1;
  return (NodeBase *)pSVar1;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }